

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

Ref __thiscall cashew::ValueBuilder::makeBreak(ValueBuilder *this,IString label)

{
  char *pcVar1;
  Value *pVVar2;
  Ref RVar3;
  undefined1 *puVar4;
  
  pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  pVVar2->type = Null;
  pVVar2 = cashew::Value::setArray(pVVar2,2);
  puVar4 = &DAT_00000018;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  (RVar3.inst)->type = Null;
  cashew::Value::free(RVar3.inst,puVar4);
  (RVar3.inst)->type = String;
  pcVar1 = DAT_00dbdd60;
  ((RVar3.inst)->field_1).str.str._M_len = BREAK;
  ((RVar3.inst)->field_1).str.str._M_str = pcVar1;
  pVVar2 = cashew::Value::push_back(pVVar2,RVar3);
  puVar4 = &DAT_00000018;
  RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)arena,0x18,8);
  (RVar3.inst)->type = Null;
  cashew::Value::free(RVar3.inst,puVar4);
  if ((char *)label.str._M_len == (char *)0x0) {
    (RVar3.inst)->type = Null;
  }
  else {
    (RVar3.inst)->type = String;
    ((RVar3.inst)->field_1).arr = (ArrayStorage *)this;
    ((RVar3.inst)->field_1).str.str._M_str = (char *)label.str._M_len;
  }
  RVar3.inst = cashew::Value::push_back(pVVar2,RVar3);
  return (Ref)RVar3.inst;
}

Assistant:

static Ref makeBreak(IString label) {
    return &makeRawArray(2)
              ->push_back(makeRawString(BREAK))
              .push_back(!!label ? makeRawString(label) : makeNull());
  }